

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O0

cpplocate * __thiscall
cpplocate::locatePath(cpplocate *this,string *relPath,string *systemDir,void *symbol)

{
  uint relPathLength;
  uint systemDirLength;
  char *relPath_00;
  char *systemDir_00;
  uint local_34;
  char *pcStack_30;
  uint length;
  char *path;
  void *symbol_local;
  string *systemDir_local;
  string *relPath_local;
  
  pcStack_30 = (char *)0x0;
  local_34 = 0;
  path = (char *)symbol;
  symbol_local = systemDir;
  systemDir_local = relPath;
  relPath_local = (string *)this;
  relPath_00 = (char *)std::__cxx11::string::c_str();
  relPathLength = std::__cxx11::string::size();
  systemDir_00 = (char *)std::__cxx11::string::c_str();
  systemDirLength = std::__cxx11::string::size();
  ::locatePath(&stack0xffffffffffffffd0,&local_34,relPath_00,relPathLength,systemDir_00,
               systemDirLength,path);
  (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
            ((_anonymous_namespace_ *)this,pcStack_30,local_34);
  return this;
}

Assistant:

std::string locatePath(const std::string & relPath, const std::string & systemDir, void * symbol)
{
    char * path = nullptr;
    unsigned int length = 0;

    ::locatePath(&path, &length, relPath.c_str(), (unsigned int)relPath.size(), systemDir.c_str(), (unsigned int)systemDir.size(), symbol);

    // Convert to string and free memory from liblocate
    return obtainStringFromLibLocate(path, length);
}